

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  cmMakefile *pcVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  size_type sVar8;
  reference pbVar9;
  cmake *pcVar10;
  string *psVar11;
  ulong uVar12;
  char *pcVar13;
  PolicyID id;
  char *local_5c8;
  bool local_5a7;
  bool local_5a3;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_490;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_488;
  const_iterator local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  const_iterator local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_450;
  string local_448;
  undefined1 local_428 [24];
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  const_iterator local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c8;
  const_iterator local_3c0;
  _Base_ptr local_3b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *foundFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  __node_base local_2e0;
  Message *globMessage;
  iterator __end7;
  iterator __begin7;
  GlobMessages *__range7;
  undefined1 local_2b8 [7];
  bool shouldExit;
  GlobMessages globMessages;
  undefined1 local_280 [8];
  string expr;
  string local_258;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  allocator<char> local_1a9;
  string local_1a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  allocator<char> local_179;
  string local_178;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  allocator<char> local_149;
  string local_148;
  int local_128;
  allocator<char> local_121;
  string local_120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  WorkingMode local_f0;
  byte local_eb;
  byte local_ea;
  byte local_e9;
  WorkingMode workingMode;
  bool warnFollowedSymlinks;
  bool warnConfigureLate;
  bool configureDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  PolicyStatus status;
  bool explicitFollowSymlinks;
  undefined1 local_b8 [8];
  Glob g;
  undefined1 local_58 [8];
  string variable;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  bool recurse_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current._7_1_ = recurse;
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar8 < 2) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                  ,0x2f9,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  variable.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  pbVar9 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  std::__cxx11::string::string((string *)local_58,(string *)pbVar9);
  g._80_8_ = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++(&local_30,0);
  cmsys::Glob::Glob((Glob *)local_b8);
  cmsys::Glob::SetRecurse((Glob *)local_b8,(bool)(i._M_current._7_1_ & 1));
  bVar2 = false;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0009,false);
  if ((i._M_current._7_1_ & 1) != 0) {
    if (files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < NEW) {
      cmsys::Glob::RecurseThroughSymlinksOn((Glob *)local_b8);
    }
    else if (files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - NEW < 3) {
      cmsys::Glob::RecurseThroughSymlinksOff((Glob *)local_b8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&workingMode);
  local_e9 = 0;
  local_ea = 0;
  local_eb = 0;
  pcVar10 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  local_f0 = cmake::GetWorkingMode(pcVar10);
  do {
    do {
      while( true ) {
        while( true ) {
          local_f8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(args);
          bVar5 = __gnu_cxx::operator!=(&local_30,&local_f8);
          if (!bVar5) {
            if ((files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < NEW) &&
               ((local_eb & 1) != 0)) {
              pcVar1 = (this->super_cmCommand).Makefile;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_448,(cmPolicies *)0x9,id);
              cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_448);
              std::__cxx11::string::~string((string *)&local_448);
            }
            local_450._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&workingMode);
            local_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&workingMode);
            std::
            sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (local_450,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_458);
            local_470._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&workingMode);
            local_478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&workingMode);
            local_468 = std::
                        unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                  (local_470,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_478);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_460,&local_468);
            local_488._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&workingMode);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_480,&local_488);
            local_490 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&workingMode,local_460,local_480);
            pcVar1 = (this->super_cmCommand).Makefile;
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_4b0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&workingMode,";");
            pcVar13 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(pcVar1,(string *)local_58,pcVar13);
            std::__cxx11::string::~string((string *)&local_4b0);
            this_local._7_1_ = 1;
            local_128 = 1;
            goto LAB_002d718b;
          }
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_30);
          bVar5 = std::operator==(pbVar9,"LIST_DIRECTORIES");
          if (!bVar5) break;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_30);
          local_100._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(args);
          bVar5 = __gnu_cxx::operator!=(&local_30,&local_100);
          if (!bVar5) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,"LIST_DIRECTORIES missing bool value.",&local_149);
            cmCommand::SetError(&this->super_cmCommand,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator(&local_149);
            this_local._7_1_ = 0;
            local_128 = 1;
            goto LAB_002d718b;
          }
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_30);
          bVar5 = cmSystemTools::IsOn(pbVar9);
          if (bVar5) {
            cmsys::Glob::SetListDirs((Glob *)local_b8,true);
            cmsys::Glob::SetRecurseListDirs((Glob *)local_b8,true);
          }
          else {
            pbVar9 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_30);
            bVar5 = cmSystemTools::IsOff(pbVar9);
            if (!bVar5) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"LIST_DIRECTORIES missing bool value.",&local_121);
              cmCommand::SetError(&this->super_cmCommand,&local_120);
              std::__cxx11::string::~string((string *)&local_120);
              std::allocator<char>::~allocator(&local_121);
              this_local._7_1_ = 0;
              local_128 = 1;
              goto LAB_002d718b;
            }
            cmsys::Glob::SetListDirs((Glob *)local_b8,false);
            cmsys::Glob::SetRecurseListDirs((Glob *)local_b8,false);
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_30);
        }
        pbVar9 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_30);
        bVar5 = std::operator==(pbVar9,"FOLLOW_SYMLINKS");
        if (bVar5) break;
        pbVar9 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_30);
        bVar5 = std::operator==(pbVar9,"RELATIVE");
        if (bVar5) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_30);
          local_188._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(args);
          bVar5 = __gnu_cxx::operator==(&local_30,&local_188);
          if (bVar5) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,"GLOB requires a directory after the RELATIVE tag.",
                       &local_1a9);
            cmCommand::SetError(&this->super_cmCommand,&local_1a8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::allocator<char>::~allocator(&local_1a9);
            this_local._7_1_ = 0;
            local_128 = 1;
            goto LAB_002d718b;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_30);
          pcVar13 = (char *)std::__cxx11::string::c_str();
          cmsys::Glob::SetRelative((Glob *)local_b8,pcVar13);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_30);
          local_1b8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(args);
          bVar5 = __gnu_cxx::operator==(&local_30,&local_1b8);
          if (bVar5) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,"GLOB requires a glob expression after the directory.",
                       &local_1d9);
            cmCommand::SetError(&this->super_cmCommand,&local_1d8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::allocator<char>::~allocator(&local_1d9);
            this_local._7_1_ = 0;
            local_128 = 1;
            goto LAB_002d718b;
          }
        }
        else {
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_30);
          bVar5 = std::operator==(pbVar9,"CONFIGURE_DEPENDS");
          if (bVar5) {
            if (((local_e9 & 1) == 0) && ((local_ea & 1) != 0)) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_200,
                         "CONFIGURE_DEPENDS flag was given after a glob expression was already evaluated."
                         ,&local_201);
              cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_200);
              std::__cxx11::string::~string((string *)&local_200);
              std::allocator<char>::~allocator(&local_201);
            }
            if (local_f0 != NORMAL_MODE) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_228,
                         "CONFIGURE_DEPENDS is invalid for script and find package modes.",
                         &local_229);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_228);
              std::__cxx11::string::~string((string *)&local_228);
              std::allocator<char>::~allocator(&local_229);
              this_local._7_1_ = 0;
              local_128 = 1;
              goto LAB_002d718b;
            }
            local_e9 = 1;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_30);
            local_238._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(args);
            bVar5 = __gnu_cxx::operator==(&local_30,&local_238);
            if (bVar5) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_258,
                         "GLOB requires a glob expression after CONFIGURE_DEPENDS.",
                         (allocator<char> *)(expr.field_2._M_local_buf + 0xf));
              cmCommand::SetError(&this->super_cmCommand,&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              std::allocator<char>::~allocator((allocator<char> *)(expr.field_2._M_local_buf + 0xf))
              ;
              this_local._7_1_ = 0;
              local_128 = 1;
              goto LAB_002d718b;
            }
          }
          else {
            pbVar9 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_30);
            std::__cxx11::string::string((string *)local_280,(string *)pbVar9);
            pbVar9 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_30);
            bVar5 = cmsys::SystemTools::FileIsFullPath(pbVar9);
            if (!bVar5) {
              psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                                  ((this->super_cmCommand).Makefile);
              std::__cxx11::string::operator=((string *)local_280,(string *)psVar11);
              uVar12 = std::__cxx11::string::empty();
              if ((uVar12 & 1) == 0) {
                pbVar9 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_30);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &globMessages.
                                super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,"/",pbVar9);
                std::__cxx11::string::operator+=
                          ((string *)local_280,
                           (string *)
                           &globMessages.
                            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::string::~string
                          ((string *)
                           &globMessages.
                            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                pbVar9 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_30);
                std::__cxx11::string::operator=((string *)local_280,(string *)pbVar9);
              }
            }
            std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::vector
                      ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                       local_2b8);
            cmsys::Glob::FindFiles
                      ((Glob *)local_b8,(string *)local_280,
                       (vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                       local_2b8);
            bVar5 = std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::empty
                              ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                                *)local_2b8);
            if (bVar5) {
LAB_002d6b20:
              if ((((i._M_current._7_1_ & 1) != 0) && (!bVar2)) &&
                 (uVar7 = cmsys::Glob::GetFollowedSymlinkCount((Glob *)local_b8), uVar7 != 0)) {
                local_eb = 1;
              }
              local_3a8 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_b8);
              cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&workingMode,local_3a8);
              if ((local_e9 & 1) == 0) {
                local_ea = 1;
              }
              else {
                local_3b0._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(local_3a8);
                local_3b8 = (_Base_ptr)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end(local_3a8);
                std::
                sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_3b0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_3b8);
                pvVar3 = local_3a8;
                local_3d0._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(local_3a8);
                local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end(local_3a8);
                local_3c8 = std::
                            unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                      (local_3d0,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_3d8);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ::__normal_iterator<std::__cxx11::string*>
                          ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            *)&local_3c0,&local_3c8);
                local_3e8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(local_3a8);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ::__normal_iterator<std::__cxx11::string*>
                          ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            *)&local_3e0,&local_3e8);
                local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::erase(pvVar3,local_3c0,local_3e0);
                pcVar10 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
                bVar4 = i._M_current._7_1_;
                if ((i._M_current._7_1_ & 1) == 0) {
                  local_5a3 = cmsys::Glob::GetListDirs((Glob *)local_b8);
                }
                else {
                  local_5a3 = cmsys::Glob::GetRecurseListDirs((Glob *)local_b8);
                }
                if ((i._M_current._7_1_ & 1) == 0) {
                  local_5a7 = false;
                }
                else {
                  local_5a7 = cmsys::Glob::GetRecurseThroughSymlinks((Glob *)local_b8);
                }
                pcVar13 = cmsys::Glob::GetRelative((Glob *)local_b8);
                if (pcVar13 == (char *)0x0) {
                  local_5c8 = "";
                }
                else {
                  local_5c8 = cmsys::Glob::GetRelative((Glob *)local_b8);
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_410,local_5c8,(allocator<char> *)(local_428 + 0x17));
                pvVar3 = local_3a8;
                cmMakefile::GetBacktrace((cmMakefile *)local_428);
                cmake::AddGlobCacheEntry
                          (pcVar10,(bool)(bVar4 & 1),local_5a3,local_5a7,&local_410,
                           (string *)local_280,pvVar3,(string *)local_58,
                           (cmListFileBacktrace *)local_428);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_428);
                std::__cxx11::string::~string((string *)&local_410);
                std::allocator<char>::~allocator((allocator<char> *)(local_428 + 0x17));
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_30);
              local_128 = 0;
            }
            else {
              bVar5 = false;
              __end7 = std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
                       begin((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                             local_2b8);
              globMessage = (Message *)
                            std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                            ::end((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                                   *)local_2b8);
              while (bVar6 = __gnu_cxx::operator!=
                                       (&__end7,(__normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
                                                 *)&globMessage), bVar6) {
                local_2e0._M_nxt =
                     (_Hash_node_base *)
                     __gnu_cxx::
                     __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
                     ::operator*(&__end7);
                if (((reference)local_2e0._M_nxt)->type == cyclicRecursion) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  pbVar9 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_30);
                  std::operator+(&local_340,"Cyclic recursion detected while globbing for \'",pbVar9
                                );
                  std::operator+(&local_320,&local_340,"\':\n");
                  std::operator+(&local_300,&local_320,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_2e0._M_nxt + 1));
                  cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_300);
                  std::__cxx11::string::~string((string *)&local_300);
                  std::__cxx11::string::~string((string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_340);
                }
                else {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  pbVar9 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_30);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&foundFiles,"Error has occurred while globbing for \'",pbVar9);
                  std::operator+(&local_380,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&foundFiles,"\' - ");
                  std::operator+(&local_360,&local_380,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_2e0._M_nxt + 1));
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_360);
                  std::__cxx11::string::~string((string *)&local_360);
                  std::__cxx11::string::~string((string *)&local_380);
                  std::__cxx11::string::~string((string *)&foundFiles);
                  bVar5 = true;
                }
                __gnu_cxx::
                __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
                ::operator++(&__end7);
              }
              if (!bVar5) goto LAB_002d6b20;
              this_local._7_1_ = 0;
              local_128 = 1;
            }
            std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
                      ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                       local_2b8);
            std::__cxx11::string::~string((string *)local_280);
            if (local_128 != 0) goto LAB_002d718b;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
    } while ((i._M_current._7_1_ & 1) == 0);
    bVar2 = true;
    cmsys::Glob::RecurseThroughSymlinksOn((Glob *)local_b8);
    local_158._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    bVar5 = __gnu_cxx::operator==(&local_30,&local_158);
  } while (!bVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.",
             &local_179);
  cmCommand::SetError(&this->super_cmCommand,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  this_local._7_1_ = 0;
  local_128 = 1;
LAB_002d718b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&workingMode);
  cmsys::Glob::~Glob((Glob *)local_b8);
  std::__cxx11::string::~string((string *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
                                      bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  std::vector<std::string> files;
  bool configureDepends = false;
  bool warnConfigureLate = false;
  bool warnFollowedSymlinks = false;
  const cmake::WorkingMode workingMode =
    this->Makefile->GetCMakeInstance()->GetWorkingMode();
  while (i != args.end()) {
    if (*i == "LIST_DIRECTORIES") {
      ++i; // skip LIST_DIRECTORIES
      if (i != args.end()) {
        if (cmSystemTools::IsOn(*i)) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmSystemTools::IsOff(*i)) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
        ++i;
      } else {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
    } else if (*i == "FOLLOW_SYMLINKS") {
      ++i; // skip FOLLOW_SYMLINKS
      if (recurse) {
        explicitFollowSymlinks = true;
        g.RecurseThroughSymlinksOn();
        if (i == args.end()) {
          this->SetError(
            "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.");
          return false;
        }
      }
    } else if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        this->SetError("GLOB requires a directory after the RELATIVE tag.");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        this->SetError("GLOB requires a glob expression after the directory.");
        return false;
      }
    } else if (*i == "CONFIGURE_DEPENDS") {
      // Generated build system depends on glob results
      if (!configureDepends && warnConfigureLate) {
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          "CONFIGURE_DEPENDS flag was given after a glob expression was "
          "already evaluated.");
      }
      if (workingMode != cmake::NORMAL_MODE) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "CONFIGURE_DEPENDS is invalid for script and find package modes.");
        return false;
      }
      configureDepends = true;
      ++i;
      if (i == args.end()) {
        this->SetError(
          "GLOB requires a glob expression after CONFIGURE_DEPENDS.");
        return false;
      }
    } else {
      std::string expr = *i;
      if (!cmsys::SystemTools::FileIsFullPath(*i)) {
        expr = this->Makefile->GetCurrentSourceDirectory();
        // Handle script mode
        if (!expr.empty()) {
          expr += "/" + *i;
        } else {
          expr = *i;
        }
      }

      cmsys::Glob::GlobMessages globMessages;
      g.FindFiles(expr, &globMessages);

      if (!globMessages.empty()) {
        bool shouldExit = false;
        for (cmsys::Glob::Message const& globMessage : globMessages) {
          if (globMessage.type == cmsys::Glob::cyclicRecursion) {
            this->Makefile->IssueMessage(
              MessageType::AUTHOR_WARNING,
              "Cyclic recursion detected while globbing for '" + *i + "':\n" +
                globMessage.content);
          } else {
            this->Makefile->IssueMessage(
              MessageType::FATAL_ERROR,
              "Error has occurred while globbing for '" + *i + "' - " +
                globMessage.content);
            shouldExit = true;
          }
        }
        if (shouldExit) {
          return false;
        }
      }

      if (recurse && !explicitFollowSymlinks &&
          g.GetFollowedSymlinkCount() != 0) {
        warnFollowedSymlinks = true;
      }

      std::vector<std::string>& foundFiles = g.GetFiles();
      cmAppend(files, foundFiles);

      if (configureDepends) {
        std::sort(foundFiles.begin(), foundFiles.end());
        foundFiles.erase(std::unique(foundFiles.begin(), foundFiles.end()),
                         foundFiles.end());
        this->Makefile->GetCMakeInstance()->AddGlobCacheEntry(
          recurse, (recurse ? g.GetRecurseListDirs() : g.GetListDirs()),
          (recurse ? g.GetRecurseThroughSymlinks() : false),
          (g.GetRelative() ? g.GetRelative() : ""), expr, foundFiles, variable,
          this->Makefile->GetBacktrace());
      } else {
        warnConfigureLate = true;
      }
      ++i;
    }
  }

  switch (status) {
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Correct behavior, yay!
      break;
    case cmPolicies::OLD:
    // Probably not really the expected behavior, but the author explicitly
    // asked for the old behavior... no warning.
    case cmPolicies::WARN:
      // Possibly unexpected old behavior *and* we actually traversed
      // symlinks without being explicitly asked to: warn the author.
      if (warnFollowedSymlinks) {
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
      }
      break;
  }

  std::sort(files.begin(), files.end());
  files.erase(std::unique(files.begin(), files.end()), files.end());
  this->Makefile->AddDefinition(variable, cmJoin(files, ";").c_str());
  return true;
}